

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDException.hpp
# Opt level: O1

void __thiscall OpenMD::OpenMDException::OpenMDException(OpenMDException *this,string *msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__OpenMDException_002fd000;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg_,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

~OpenMDException() throw() {}